

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O1

bool TranslateModule(ExpressionTranslateContext *ctx,ExprModule *expression,
                    SmallArray<const_char_*,_32U> *dependencies)

{
  TypeBase **ppTVar1;
  TypeBase *pTVar2;
  FunctionData **ppFVar3;
  ExprBase *pEVar4;
  OutputContext *pOVar5;
  bool bVar6;
  char *pcVar7;
  ExpressionContext *pEVar8;
  ulong uVar9;
  ulong uVar10;
  
  bVar6 = TranslateModuleImports(ctx,dependencies);
  if (bVar6) {
    pEVar8 = ctx->ctx;
    uVar10 = (ulong)(pEVar8->types).count;
    if (uVar10 != 0) {
      ppTVar1 = (pEVar8->types).data;
      uVar9 = 0;
      do {
        pTVar2 = ppTVar1[uVar9];
        pTVar2->typeIndex = (uint)uVar9;
        pTVar2->hasTranslation = false;
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
    }
    uVar10 = (ulong)(pEVar8->functions).count;
    if (uVar10 != 0) {
      ppFVar3 = (pEVar8->functions).data;
      uVar9 = 0;
      do {
        ppFVar3[uVar9]->nextTranslateRestoreBlock = 1;
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
    }
    PrintIndentedLine(ctx,"#include \"runtime.h\"");
    PrintIndentedLine(ctx,"// Typeid redirect table");
    PrintIndentedLine(ctx,"static unsigned __nullcTR[%d];",(ulong)(ctx->ctx->types).count);
    PrintIndentedLine(ctx,"// Function pointer table");
    PrintIndentedLine(ctx,"static __nullcFunctionArray* __nullcFM;");
    PrintIndentedLine(ctx,"// Function pointer redirect table");
    PrintIndentedLine(ctx,"static unsigned __nullcFR[%d];",(ulong)(ctx->ctx->functions).count);
    OutputContext::Print(ctx->output,"\n",1);
    TranslateModuleTypePrototypes(ctx);
    TranslateModuleTypeDefinitions(ctx);
    TranslateModuleFunctionPrototypes(ctx);
    TranslateModuleGlobalVariables(ctx);
    TranslateModuleFunctionDefinitions(ctx,expression);
    PrintIndentedLine(ctx,"// Module initializers");
    pEVar8 = ctx->ctx;
    if (1 < (pEVar8->imports).count) {
      uVar10 = 1;
      do {
        pcVar7 = GetModuleMainName(ctx->allocator,(pEVar8->imports).data[uVar10]->name);
        PrintIndentedLine(ctx,"extern int %s();",pcVar7);
        uVar10 = uVar10 + 1;
        pEVar8 = ctx->ctx;
      } while (uVar10 < (pEVar8->imports).count);
    }
    OutputContext::Print(ctx->output,"\n",1);
    PrintIndentedLine(ctx,"// Global code");
    PrintIndentedLine(ctx,"int %s()",ctx->mainName);
    PrintIndentedLine(ctx,"{");
    ctx->depth = ctx->depth + 1;
    PrintIndentedLine(ctx,"static int moduleInitialized = 0;");
    PrintIndentedLine(ctx,"if(moduleInitialized++)");
    ctx->depth = ctx->depth + 1;
    PrintIndentedLine(ctx,"return 0;");
    ctx->depth = ctx->depth - 1;
    PrintIndentedLine(ctx,"static int pointerSizeTest[sizeof(void*) == %d ? 1 : -1];",8);
    PrintIndentedLine(ctx,"__nullcFM = __nullcGetFunctionTable();");
    PrintIndentedLine(ctx,"int __local = 0;");
    PrintIndentedLine(ctx,"__nullcRegisterBase(&__local);");
    PrintIndentedLine(ctx,"__nullcInitBaseModule();");
    OutputContext::Print(ctx->output,"\n",1);
    PrintIndentedLine(ctx,"// Initialize modules");
    pEVar8 = ctx->ctx;
    if (1 < (pEVar8->imports).count) {
      uVar10 = 1;
      do {
        pcVar7 = GetModuleMainName(ctx->allocator,(pEVar8->imports).data[uVar10]->name);
        PrintIndentedLine(ctx,"%s();",pcVar7);
        uVar10 = uVar10 + 1;
        pEVar8 = ctx->ctx;
      } while (uVar10 < (pEVar8->imports).count);
    }
    OutputContext::Print(ctx->output,"\n",1);
    TranslateModuleTypeInformation(ctx);
    TranslateModuleGlobalVariableInformation(ctx);
    TranslateModuleGlobalFunctionInformation(ctx);
    PrintIndentedLine(ctx,"// Setup");
    for (pEVar4 = (expression->setup).head; pEVar4 != (ExprBase *)0x0; pEVar4 = pEVar4->next) {
      PrintIndent(ctx);
      Translate(ctx,pEVar4);
      Print(ctx,";");
      OutputContext::Print(ctx->output,"\n",1);
    }
    OutputContext::Print(ctx->output,"\n",1);
    PrintIndentedLine(ctx,"// Expressions");
    for (pEVar4 = (expression->expressions).head; pEVar4 != (ExprBase *)0x0; pEVar4 = pEVar4->next)
    {
      PrintIndent(ctx);
      Translate(ctx,pEVar4);
      Print(ctx,";");
      OutputContext::Print(ctx->output,"\n",1);
    }
    PrintIndentedLine(ctx,"return 0;");
    ctx->depth = ctx->depth - 1;
    PrintIndentedLine(ctx,"}");
    pOVar5 = ctx->output;
    if (pOVar5->outputBufPos != 0) {
      (*pOVar5->writeStream)(pOVar5->stream,pOVar5->outputBuf,pOVar5->outputBufPos);
    }
    pOVar5->outputBufPos = 0;
  }
  return bVar6;
}

Assistant:

bool TranslateModule(ExpressionTranslateContext &ctx, ExprModule *expression, SmallArray<const char*, 32> &dependencies)
{
	if(!TranslateModuleImports(ctx, dependencies))
		return false;

	// Generate type indexes
	for(unsigned i = 0; i < ctx.ctx.types.size(); i++)
	{
		TypeBase *type = ctx.ctx.types[i];

		type->typeIndex = i;

		type->hasTranslation = false;
	}

	// Generate function indexes
	for(unsigned i = 0; i < ctx.ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.ctx.functions[i];

		function->nextTranslateRestoreBlock = 1;
	}

	PrintIndentedLine(ctx, "#include \"runtime.h\"");
	PrintIndentedLine(ctx, "// Typeid redirect table");
	PrintIndentedLine(ctx, "static unsigned __nullcTR[%d];", ctx.ctx.types.size());
	PrintIndentedLine(ctx, "// Function pointer table");
	PrintIndentedLine(ctx, "static __nullcFunctionArray* __nullcFM;");
	PrintIndentedLine(ctx, "// Function pointer redirect table");
	PrintIndentedLine(ctx, "static unsigned __nullcFR[%d];", ctx.ctx.functions.size());
	PrintLine(ctx);

	TranslateModuleTypePrototypes(ctx);

	TranslateModuleTypeDefinitions(ctx);
	
	TranslateModuleFunctionPrototypes(ctx);

	TranslateModuleGlobalVariables(ctx);
	
	TranslateModuleFunctionDefinitions(ctx, expression);

	PrintIndentedLine(ctx, "// Module initializers");

	for(unsigned i = 1; i < ctx.ctx.imports.size(); i++)
	{
		ModuleData *data = ctx.ctx.imports[i];

		PrintIndentedLine(ctx, "extern int %s();", GetModuleMainName(ctx.allocator, data->name));
	}

	PrintLine(ctx);
	PrintIndentedLine(ctx, "// Global code");

	PrintIndentedLine(ctx, "int %s()", ctx.mainName);
	PrintIndentedLine(ctx, "{");

	ctx.depth++;

	PrintIndentedLine(ctx, "static int moduleInitialized = 0;");
	PrintIndentedLine(ctx, "if(moduleInitialized++)");

	ctx.depth++;
	PrintIndentedLine(ctx, "return 0;");
	ctx.depth--;

	PrintIndentedLine(ctx, "static int pointerSizeTest[sizeof(void*) == %d ? 1 : -1];", int(sizeof(void*)));

	PrintIndentedLine(ctx, "__nullcFM = __nullcGetFunctionTable();");
	PrintIndentedLine(ctx, "int __local = 0;");
	PrintIndentedLine(ctx, "__nullcRegisterBase(&__local);");
	PrintIndentedLine(ctx, "__nullcInitBaseModule();");

	PrintLine(ctx);
	PrintIndentedLine(ctx, "// Initialize modules");

	for(unsigned i = 1; i < ctx.ctx.imports.size(); i++)
	{
		ModuleData *data = ctx.ctx.imports[i];

		PrintIndentedLine(ctx, "%s();", GetModuleMainName(ctx.allocator, data->name));
	}

	PrintLine(ctx);

	TranslateModuleTypeInformation(ctx);
	
	TranslateModuleGlobalVariableInformation(ctx);
	
	TranslateModuleGlobalFunctionInformation(ctx);
	
	PrintIndentedLine(ctx, "// Setup");

	for(ExprBase *value = expression->setup.head; value; value = value->next)
	{
		PrintIndent(ctx);

		Translate(ctx, value);

		Print(ctx, ";");

		PrintLine(ctx);
	}

	PrintLine(ctx);
	PrintIndentedLine(ctx, "// Expressions");

	for(ExprBase *value = expression->expressions.head; value; value = value->next)
	{
		PrintIndent(ctx);

		Translate(ctx, value);

		Print(ctx, ";");

		PrintLine(ctx);
	}

	PrintIndentedLine(ctx, "return 0;");

	ctx.depth--;

	PrintIndentedLine(ctx, "}");

	ctx.output.Flush();

	return true;
}